

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O0

range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
__thiscall tchecker::system::locs_t::locations(locs_t *this,process_id_t pid)

{
  size_type sVar1;
  invalid_argument *this_00;
  const_reference pvVar2;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar3;
  const_iterator local_58;
  const_iterator_t local_50;
  const_iterator local_48;
  const_iterator_t local_40 [3];
  uint local_24;
  locs_t *plStack_20;
  process_id_t pid_local;
  locs_t *this_local;
  
  local_24 = pid;
  plStack_20 = this;
  sVar1 = std::
          vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
          ::size(&this->_process_locs);
  if (sVar1 <= pid) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"tchecker::locs_t::locations: pid out of range")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::
           vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ::operator[](&this->_process_locs,(ulong)local_24);
  local_48 = std::
             vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
             ::begin(pvVar2);
  const_iterator_t::const_iterator_t(local_40,&local_48);
  pvVar2 = std::
           vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ::operator[](&this->_process_locs,(ulong)local_24);
  local_58 = std::
             vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
             ::end(pvVar2);
  const_iterator_t::const_iterator_t(&local_50,&local_58);
  rVar3 = make_range<tchecker::system::locs_t::const_iterator_t,tchecker::system::locs_t::const_iterator_t>
                    (local_40,&local_50);
  return rVar3;
}

Assistant:

tchecker::range_t<tchecker::system::locs_t::const_iterator_t> locs_t::locations(tchecker::process_id_t pid) const
{
  if (pid >= _process_locs.size())
    throw std::invalid_argument("tchecker::locs_t::locations: pid out of range");
  return tchecker::make_range(const_iterator_t{_process_locs[pid].begin()}, const_iterator_t{_process_locs[pid].end()});
}